

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec-ops.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *name;
  axbStatus_t aVar1;
  char *name_00;
  axbHandle_s *axbHandle;
  axbOpBackend_s *op_backend;
  axbMemBackend_s *mem_backend;
  axbHandle_s *local_38;
  axbOpBackend_s *local_30;
  axbMemBackend_s *local_28;
  
  if (argc < 2) {
    main_cold_5();
  }
  else {
    name = argv[1];
    name_00 = name;
    if (argc != 2) {
      name_00 = argv[2];
    }
    puts("Initializing libaxb...");
    aVar1 = axbInit(&local_38);
    if (aVar1 != 0) {
      main_cold_1();
      return aVar1;
    }
    aVar1 = axbMemBackendGetByName(local_38,&local_28,name);
    if (aVar1 != 0) {
      main_cold_2();
      return aVar1;
    }
    if (local_28 != (axbMemBackend_s *)0x0) {
      printf("Using memory backend %s\n",name);
      aVar1 = axbOpBackendGetByName(local_38,&local_30,name_00);
      if (aVar1 != 0) {
        main_cold_3();
        return aVar1;
      }
      if (local_30 != (axbOpBackend_s *)0x0) {
        printf("Using op backend %s\n",name_00);
        setup(local_38,local_28,local_30);
        puts("Shutting down libaxb...");
        aVar1 = axbFinalize(local_38);
        if (aVar1 == 0) {
          puts("Completed successfully");
          return 0;
        }
        main_cold_4();
        return aVar1;
      }
    }
    fprintf(_stderr,"ERROR: Cannot find memory backend %s\n",name);
  }
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
  struct axbHandle_s *axbHandle;
  const char *mem_backend_name = argv[1];
  const char *op_backend_name = argv[2];

  if (argc < 2) {
    fprintf(stderr, "Missing argument: MemoryBackend\n");
    return EXIT_FAILURE;
  }
  else if (argc == 2) { // mem backend equals op backend
    op_backend_name = argv[1];
  }

  printf("Initializing libaxb...\n");
  AXB_ERR_CHECK(axbInit(&axbHandle));

  struct axbMemBackend_s *mem_backend;
  AXB_ERR_CHECK(axbMemBackendGetByName(axbHandle, &mem_backend, mem_backend_name));
  if (!mem_backend) {
    fprintf(stderr, "ERROR: Cannot find memory backend %s\n", mem_backend_name);
    return EXIT_FAILURE;
  }
  printf("Using memory backend %s\n", mem_backend_name);

  struct axbOpBackend_s *op_backend;
  AXB_ERR_CHECK(axbOpBackendGetByName(axbHandle, &op_backend, op_backend_name));
  if (!op_backend) {
    fprintf(stderr, "ERROR: Cannot find memory backend %s\n", mem_backend_name);
    return EXIT_FAILURE;
  }
  printf("Using op backend %s\n", op_backend_name);

  setup(axbHandle, mem_backend, op_backend);


  printf("Shutting down libaxb...\n");
  AXB_ERR_CHECK(axbFinalize(axbHandle));

  printf("Completed successfully\n");

  return EXIT_SUCCESS;
}